

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

double __thiscall
PlanningUnitMADPDiscrete::GetJAOHProbs
          (PlanningUnitMADPDiscrete *this,JointBeliefInterface *jb,LIndex jaohI,LIndex p_jaohI,
          JointBeliefInterface *p_jb,JointPolicyDiscrete *jpol)

{
  Index *pIVar1;
  Index *pIVar2;
  long lVar3;
  code *pcVar4;
  LIndex LVar5;
  PlanningUnitMADPDiscrete *pPVar6;
  Index IVar7;
  Index t;
  ulong uVar8;
  JointBeliefInterface *pJVar9;
  ostream *poVar10;
  undefined8 uVar11;
  E *this_00;
  JointBeliefInterface *pJVar12;
  Index *joIs;
  Index *jaIs;
  Index *joIs_00;
  Index *jaIs_00;
  double dVar13;
  Index aIStack_90 [2];
  LIndex LStack_88;
  Index aIStack_80 [2];
  JointPolicyDiscrete *local_78;
  long local_70;
  LIndex local_68;
  LIndex local_60;
  undefined1 *local_58;
  Index local_4c;
  JointBeliefInterface *local_48;
  PlanningUnitMADPDiscrete *local_40;
  JointBeliefInterface *local_38;
  
  if ((((p_jb == (JointBeliefInterface *)0x0) && (p_jaohI == 0)) &&
      (jpol == (JointPolicyDiscrete *)0x0)) && ((this->_m_params)._m_JointBeliefs == true)) {
    aIStack_80[0] = 0x466370;
    aIStack_80[1] = 0;
    IVar7 = Globals::CastLIndexToIndex(jaohI);
    aIStack_80[0] = 0x46638a;
    aIStack_80[1] = 0;
    (**(code **)((long)*jb + 0xa8))
              (jb,(this->_m_jBeliefCache).
                  super__Vector_base<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[IVar7]);
    aIStack_80[0] = 0x466392;
    aIStack_80[1] = 0;
    IVar7 = Globals::CastLIndexToIndex(jaohI);
    dVar13 = (this->_m_jaohProbs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[IVar7];
  }
  else {
    aIStack_80[0] = 0x4663bd;
    aIStack_80[1] = 0;
    local_78 = jpol;
    local_48 = jb;
    local_38 = p_jb;
    IVar7 = GetTimeStepForJAOHI(this,jaohI);
    aIStack_80[0] = 0x4663cb;
    aIStack_80[1] = 0;
    t = GetTimeStepForJAOHI(this,p_jaohI);
    uVar8 = (ulong)IVar7 * 4 + 0xf & 0xfffffffffffffff0;
    jaIs_00 = (Index *)((long)&local_78 - uVar8);
    joIs_00 = (Index *)((long)jaIs_00 - uVar8);
    local_68 = jaohI;
    local_60 = p_jaohI;
    local_58 = (undefined1 *)&local_78;
    local_40 = this;
    joIs_00[-2] = 0x466412;
    joIs_00[-1] = 0;
    GetJointActionObservationHistoryArrays(this,jaohI,IVar7,jaIs_00,joIs_00);
    pPVar6 = local_40;
    pJVar9 = local_48;
    LVar5 = local_60;
    pJVar12 = (JointBeliefInterface *)(ulong)t;
    uVar8 = (long)pJVar12 * 4 + 0xfU & 0xfffffffffffffff0;
    jaIs = (Index *)((long)joIs_00 - uVar8);
    joIs = (Index *)((long)jaIs - uVar8);
    if (local_60 == 0) {
      local_4c = IVar7;
      if (local_38 == (JointBeliefInterface *)0x0) {
        lVar3 = *(long *)((long)*local_48 + -0xb8);
        local_38 = (JointBeliefInterface *)((long)&local_48->field_0x0 + lVar3);
        pcVar4 = *(code **)((long)*local_40->_m_madp + 0x50);
        joIs[-2] = 0x4664f6;
        joIs[-1] = 0;
        uVar11 = (*pcVar4)();
        pJVar12 = local_38;
        pcVar4 = *(code **)(*(long *)((long)&pJVar9->field_0x0 + lVar3) + 0x28);
        joIs[-2] = 0x466504;
        joIs[-1] = 0;
        (*pcVar4)(pJVar12,uVar11);
      }
      else {
LAB_0046650b:
        pJVar9 = local_48;
        pcVar4 = *(code **)((long)*local_48 + 0xa8);
        joIs[-2] = 0x46651f;
        joIs[-1] = 0;
        (*pcVar4)(pJVar9);
      }
LAB_00466523:
      pPVar6 = local_40;
      IVar7 = local_4c;
      *(JointPolicyDiscrete **)(joIs + -2) = local_78;
      *(LIndex *)(joIs + -4) = local_60;
      joIs[-6] = 0x46653e;
      joIs[-5] = 0;
      dVar13 = GetJAOHProbsRecursively
                         (pPVar6,pJVar9,jaIs_00,joIs_00,t,IVar7,*(LIndex *)(joIs + -4),
                          *(JointPolicyDiscrete **)(joIs + -2));
    }
    else {
      dVar13 = 0.0;
      if (t < IVar7) {
        local_4c = IVar7;
        if (pJVar12 == (JointBeliefInterface *)0x0) {
          joIs[-2] = 0x28;
          joIs[-1] = 0;
          uVar11 = *(undefined8 *)(joIs + -2);
          joIs[-2] = 0x466647;
          joIs[-1] = 0;
          this_00 = (E *)__cxa_allocate_exception(uVar11);
          joIs[-2] = 0x466659;
          joIs[-1] = 0;
          E::E(this_00," p_jaohI != 0 but t_p == 0 ");
          *(undefined1 **)(joIs + -2) = &LAB_0046666f;
          __cxa_throw(this_00,&E::typeinfo,E::~E);
        }
        joIs[-2] = 0x46646d;
        joIs[-1] = 0;
        GetJointActionObservationHistoryArrays(pPVar6,LVar5,t,jaIs,joIs);
        pPVar6 = local_40;
        LVar5 = local_68;
        pJVar9 = (JointBeliefInterface *)0x0;
        do {
          if (pJVar12 == pJVar9) {
            if (local_38 != (JointBeliefInterface *)0x0) goto LAB_0046650b;
            if ((local_40->_m_params)._m_JointBeliefs == true) {
              joIs[-2] = 0x466571;
              joIs[-1] = 0;
              IVar7 = Globals::CastLIndexToIndex(LVar5);
              pJVar12 = local_48;
              pJVar9 = (pPVar6->_m_jBeliefCache).
                       super__Vector_base<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[IVar7];
              pcVar4 = *(code **)((long)*local_48 + 0xa8);
              joIs[-2] = 0x46658b;
              joIs[-1] = 0;
              (*pcVar4)(pJVar12,pJVar9);
              joIs[-2] = 0x466593;
              joIs[-1] = 0;
              IVar7 = Globals::CastLIndexToIndex(LVar5);
              LVar5 = local_60;
              local_38 = (JointBeliefInterface *)
                         (pPVar6->_m_jaohProbs).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[IVar7];
              joIs[-2] = 0x4665af;
              joIs[-1] = 0;
              IVar7 = Globals::CastLIndexToIndex(LVar5);
              return (double)local_38 /
                     (pPVar6->_m_jaohProbs).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[IVar7];
            }
            local_70 = *(long *)((long)*local_48 + -0xb8);
            local_68 = (long)&local_48->field_0x0 + local_70;
            pcVar4 = *(code **)((long)*local_40->_m_madp + 0x50);
            local_38 = pJVar12;
            joIs[-2] = 0x4665f2;
            joIs[-1] = 0;
            uVar11 = (*pcVar4)();
            LVar5 = local_68;
            pcVar4 = *(code **)(*(long *)((long)&local_48->field_0x0 + local_70) + 0x28);
            joIs[-2] = 0x466608;
            joIs[-1] = 0;
            (*pcVar4)(LVar5,uVar11);
            joIs[-4] = 0;
            joIs[-3] = 0;
            joIs[-2] = 0;
            pJVar12 = local_38;
            pPVar6 = local_40;
            pJVar9 = local_48;
            joIs[-1] = 0;
            joIs[-6] = 0x466632;
            joIs[-5] = 0;
            GetJAOHProbsRecursively
                      (pPVar6,pJVar9,jaIs,joIs,0,(Index)pJVar12,*(LIndex *)(joIs + -4),
                       *(JointPolicyDiscrete **)(joIs + -2));
            goto LAB_00466523;
          }
        } while ((jaIs_00[(long)pJVar9] == jaIs[(long)pJVar9]) &&
                (pIVar1 = joIs_00 + (long)pJVar9, pIVar2 = joIs + (long)pJVar9,
                pJVar9 = (JointBeliefInterface *)&pJVar9->field_0x1, *pIVar1 == *pIVar2));
        joIs[-2] = 0x4664ac;
        joIs[-1] = 0;
        poVar10 = std::operator<<((ostream *)&std::cerr,
                                  "GetJAOHProbs:: Warning pred. inconsistent with requested jaohI");
        joIs[-2] = 0x4664b4;
        joIs[-1] = 0;
        std::endl<char,std::char_traits<char>>(poVar10);
        dVar13 = 0.0;
      }
    }
  }
  return dVar13;
}

Assistant:

double 
PlanningUnitMADPDiscrete::GetJAOHProbs(
    //output args:
    JointBeliefInterface* jb, 
    //input args:
    LIndex jaohI, // the jaohI for which we want to know the probs
    LIndex p_jaohI, //=0 the GIVEN predecessor
    const JointBeliefInterface* p_jb,// = NULL, // the corresponding GIVEN jb of p
    const JointPolicyDiscrete * jpol// = NULL // the policy followed in
    ) const
{
    if(p_jaohI == 0 && p_jb == NULL && jpol==NULL) //the cacheable case
        if(_m_params.GetComputeJointBeliefs() )
        {
            //return the cached results...
            //
            //we have to make a copy (can't do jb = ..., because that would 
            //not be reflected in the calling function)
            *jb = *_m_jBeliefCache[CastLIndexToIndex(jaohI)]; 
            return (_m_jaohProbs[CastLIndexToIndex(jaohI)]);
        }
    //we can't get the cached result, so we have to compute.

    Index t = GetTimeStepForJAOHI(jaohI);
    Index t_p = GetTimeStepForJAOHI(p_jaohI);
    
    Index jaIs[t];
    Index joIs[t];
    GetJointActionObservationHistoryArrays(jaohI, t, jaIs, joIs);      
#if DEBUG_PUD_JAOHPROBS
    vector<Index> jaIsv,joIsv;
    JointActionObservationHistoryTree* jaoht = 
        GetJointActionObservationHistoryTree(jaohI);
    jaoht->GetJointActionObservationHistory()->
        GetJointActionObservationHistoryVectors(jaIsv, joIsv);
    
    cout << "t " << t << " " << jaohI  
         << "\njaIsv:" << SoftPrintVector(jaIsv)
         << ", joIsv:" << SoftPrintVector(joIsv)
         << ", jaoht:" << jaoht->GetJointActionObservationHistory()->SoftPrint()
         << endl;

    for(Index i=0;i!=t;++i)
        cout << "jaIs["<<i<<"]=" << jaIs[i] << " ";
    cout << endl;
#endif
    Index p_jaIs[t_p];
    Index p_joIs[t_p];
    
    if(p_jaohI != 0)
    {
        //check that p_jaohI is indeed a predecessor of jaohI, this consists of
        //two checks 1) the (quick) stage check::
        if (t_p >= t)
            return (0.0);

        if(t_p == 0)
            throw E(" p_jaohI != 0 but t_p == 0 ");

        //and 2) the consistency check
        GetJointActionObservationHistoryArrays(p_jaohI, t_p, p_jaIs, p_joIs); 
        for(Index tI=0; tI < t_p; tI++)
        {
            if ( jaIs[tI] == p_jaIs[tI] && 
                 joIs[tI] == p_joIs[tI]    )  
                ; //consistent
            else
            {
                cerr << "GetJAOHProbs:: Warning pred. inconsistent with requested jaohI" << endl;
                return (0.0); // p_jaohI is inconsistent with jaohI.
            }
        }
    }
    //p_jaIs[ t_p ... (t-1) ] contains the joint actions `still to be taken'
    //to get from p_jaohI to jaohI.

    if(p_jaohI != 0 && p_jb == NULL)
    {
        // a predecessor is specified, but without accompanying joint belief.
        // In this case we assume that a pure (deterministic) joint policy
        // that is consistent with p_jaohI has been followed.
        if(_m_params.GetComputeJointBeliefs() )
        {
            //if joint beliefs are cache use them:
            *jb = *_m_jBeliefCache[CastLIndexToIndex(jaohI)]; 
            double pr = _m_jaohProbs[CastLIndexToIndex(jaohI)];
            double p_pr = _m_jaohProbs[CastLIndexToIndex(p_jaohI)];
            double pr_cond = pr / p_pr;
            return pr_cond;
        }
        else
        {
            // Here we compute the joint belief corresponding to p_jaohI for
            // such a pure joint policy. by performing the belief update
            // starting from the first time step
            jb->Set( *GetMADPDI()->GetISD() );
            //*jb = *GetNewJointBeliefFromISD();
            GetJAOHProbsRecursively(jb, p_jaIs, p_joIs, 0, t_p, 
                    Globals::INITIAL_JAOHI );        
            //GetJAOHProbsRecursively(jb, p_jaIs, p_joIs, t0, t_p, jaoh0 );
        }
    }
    else if ( p_jb == NULL ) // and p_jaohI == 0
        jb->Set( *GetMADPDI()->GetISD() );
        //*jb = *GetNewJointBeliefFromISD();
    else
        *jb = *p_jb; //copy by value, we don't want to alter p_jb!

    double p = GetJAOHProbsRecursively(jb, 
            jaIs, joIs, t_p, t,
            //jaohI, 
            p_jaohI, 
            jpol);

    return(p);
}